

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool Fossilize::pnext_chain_stype_is_hash_invariant(VkStructureType sType)

{
  bool local_9;
  VkStructureType sType_local;
  
  if ((sType == VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO) ||
     (sType == VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT)) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

static bool pnext_chain_stype_is_hash_invariant(VkStructureType sType)
{
	switch (sType)
	{
	case VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO:
	case VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT:
		// This is purely used for copying purposes.
		// For hashing purposes, this must be ignored.
		return true;

	default:
		break;
	}

	return false;
}